

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O0

DWORD __thiscall
FNodeBuilder::PushGLSeg
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          FPrivSeg *seg,vertex_t *outVerts)

{
  uint uVar1;
  undefined1 local_60 [8];
  glseg_t newseg;
  vertex_t *outVerts_local;
  FPrivSeg *seg_local;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs_local;
  FNodeBuilder *this_local;
  
  local_60 = (undefined1  [8])(outVerts + seg->v1);
  newseg.super_seg_t.v1 = outVerts + seg->v2;
  newseg.super_seg_t.frontsector = seg->backsector;
  newseg.super_seg_t.linedef = (line_t_conflict *)seg->frontsector;
  if (seg->linedef == -1) {
    newseg.super_seg_t.sidedef = (side_t *)0x0;
    newseg.super_seg_t.v2 = (vertex_t *)0x0;
  }
  else {
    newseg.super_seg_t.sidedef = (side_t *)(this->Level->Lines + seg->linedef);
    newseg.super_seg_t.v2 = (vertex_t *)(this->Level->Sides + seg->sidedef);
  }
  newseg.super_seg_t.backsector._0_4_ = seg->partner;
  newseg._48_8_ = outVerts;
  uVar1 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Push(segs,(glseg_t *)local_60);
  return uVar1;
}

Assistant:

DWORD FNodeBuilder::PushGLSeg (TArray<glseg_t> &segs, const FPrivSeg *seg, vertex_t *outVerts)
{
	glseg_t newseg;

	newseg.v1 = outVerts + seg->v1;
	newseg.v2 = outVerts + seg->v2;
	newseg.backsector = seg->backsector;
	newseg.frontsector = seg->frontsector;
	if (seg->linedef != -1)
	{
		newseg.linedef = Level.Lines + seg->linedef;
		newseg.sidedef = Level.Sides + seg->sidedef;
	}
	else
	{
		newseg.linedef = NULL;
		newseg.sidedef = NULL;
	}
	newseg.Partner = seg->partner;
	return (DWORD)segs.Push (newseg);
}